

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_930;
  Message local_928;
  string local_920;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_8d8 [8];
  Psbt psbt2;
  Message local_880;
  ByteData local_878;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_2;
  Message local_828;
  uint32_t local_820 [2];
  undefined1 local_818 [8];
  AssertionResult gtest_ar_1;
  TxOutReference txout_2r;
  TxOut txout_2;
  TxOut txout_1;
  Amount amount;
  undefined1 local_6f0 [8];
  Address addr2;
  undefined1 local_560 [8];
  Address addr1;
  KeyData key2;
  KeyData key1;
  undefined1 local_140 [8];
  string path2;
  undefined1 local_118 [8];
  string path1;
  undefined1 local_e0 [8];
  HDWallet wallet2;
  undefined1 local_b0 [8];
  HDWallet wallet1;
  Message local_90 [3];
  uint32_t local_78;
  uint local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Psbt psbt;
  Psbt_SetTxOutOnly_Test *this_local;
  
  cfd::core::Psbt::Psbt((Psbt *)&gtest_ar.message_);
  local_74 = 0;
  local_78 = cfd::core::Psbt::GetTxOutCount((Psbt *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_70,"0",(int *)"psbt.GetTxOutCount()",&local_74,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &wallet1.seed_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x237,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &wallet1.seed_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_90);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &wallet1.seed_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet
            ((HDWallet *)local_b0,
             (ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &wallet2.seed_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)((long)&path1.field_2 + 8),&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_e0,(ByteData *)((long)&path1.field_2 + 8));
  cfd::core::ByteData::~ByteData((ByteData *)((long)&path1.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_118,"44h/0h/0h/0/2",(allocator *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(path2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_140,"44h/0h/0h/0/2",
             (allocator *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&key1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(HDWallet *)local_b0,kTestnet,
             (string *)local_118);
  cfd::core::HDWallet::GeneratePubkeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (HDWallet *)local_e0,kTestnet,(string *)local_140);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::Address
            ((Address *)local_560,kCfdIllegalArgumentError,kVersion0,
             (Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Pubkey::~Pubkey
            ((Pubkey *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::GetPubkey
            ((Pubkey *)&amount.ignore_check_,
             (KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Address::Address
            ((Address *)local_6f0,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&amount.ignore_check_
            );
  cfd::core::Pubkey::~Pubkey((Pubkey *)&amount.ignore_check_);
  cfd::core::Amount::Amount
            ((Amount *)
             ((long)&txout_1.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 0x10),100000000);
  cfd::core::TxOut::TxOut
            ((TxOut *)((long)&txout_2.super_AbstractTxOut.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10),
             (Amount *)
             ((long)&txout_1.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 0x10),(Address *)local_560);
  cfd::core::TxOut::TxOut
            ((TxOut *)((long)&txout_2r.super_AbstractTxOutReference.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10),
             (Amount *)
             ((long)&txout_1.super_AbstractTxOut.locking_script_.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data + 0x10),(Address *)local_6f0);
  cfd::core::TxOutReference::TxOutReference
            ((TxOutReference *)&gtest_ar_1.message_,
             (TxOut *)((long)&txout_2r.super_AbstractTxOutReference.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10));
  cfd::core::Psbt::AddTxOut
            ((Psbt *)&gtest_ar.message_,
             (TxOut *)((long)&txout_2.super_AbstractTxOut.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10));
  cfd::core::Psbt::AddTxOut((Psbt *)&gtest_ar.message_,(TxOutReference *)&gtest_ar_1.message_);
  local_820[1] = 2;
  local_820[0] = cfd::core::Psbt::GetTxOutCount((Psbt *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_818,"2","psbt.GetTxOutCount()",(int *)(local_820 + 1),
             local_820);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x248,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  cfd::core::Psbt::GetData(&local_878,(Psbt *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_860,&local_878);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_840,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_860);
  cfd::core::ByteData::~ByteData(&local_878);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_880);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x24a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_880);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  cfd::core::Psbt::GetData((ByteData *)&gtest_ar_3.message_,(Psbt *)&gtest_ar.message_);
  cfd::core::Psbt::Psbt((Psbt *)local_8d8,(ByteData *)&gtest_ar_3.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_3.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_920,(Psbt *)local_8d8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_900,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_920);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_928);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              (&local_930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x24c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_930,&local_928);
    testing::internal::AssertHelper::~AssertHelper(&local_930);
    testing::Message::~Message(&local_928);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  cfd::core::Psbt::~Psbt((Psbt *)local_8d8);
  cfd::core::TxOutReference::~TxOutReference((TxOutReference *)&gtest_ar_1.message_);
  cfd::core::TxOut::~TxOut
            ((TxOut *)((long)&txout_2r.super_AbstractTxOutReference.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10));
  cfd::core::TxOut::~TxOut
            ((TxOut *)((long)&txout_2.super_AbstractTxOut.locking_script_.script_stack_.
                              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                              ._M_impl.super__Vector_impl_data + 0x10));
  cfd::core::Address::~Address((Address *)local_6f0);
  cfd::core::Address::~Address((Address *)local_560);
  cfd::core::KeyData::~KeyData
            ((KeyData *)&addr1.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::KeyData::~KeyData
            ((KeyData *)
             &key2.fingerprint_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_118);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_e0);
  cfd::core::HDWallet::~HDWallet((HDWallet *)local_b0);
  cfd::core::Psbt::~Psbt((Psbt *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}